

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O0

void BuilderTests<GrpcLikeMessageBuilder,_GrpcLikeMessageBuilder>::
     builder_movector_after_finish_test(void)

{
  Color color;
  bool val;
  Offset<MyGame::Example::Monster> root;
  SizeT SVar1;
  string local_158;
  undefined1 local_138 [8];
  GrpcLikeMessageBuilder dst;
  SizeT src_size;
  undefined1 local_90 [4];
  Offset<MyGame::Example::Monster> root_offset1;
  GrpcLikeMessageBuilder src;
  
  GrpcLikeMessageBuilder::GrpcLikeMessageBuilder((GrpcLikeMessageBuilder *)local_90);
  root = populate1((FlatBufferBuilder *)&src);
  flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
            ((FlatBufferBuilderImpl<false> *)&src,root,(char *)0x0);
  dst.super_FlatBufferBuilder.string_pool._4_4_ =
       flatbuffers::FlatBufferBuilderImpl<false>::GetSize((FlatBufferBuilderImpl<false> *)&src);
  GrpcLikeMessageBuilder::GrpcLikeMessageBuilder
            ((GrpcLikeMessageBuilder *)local_138,(GrpcLikeMessageBuilder *)local_90);
  SVar1 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize((FlatBufferBuilderImpl<false> *)&dst);
  TestEq<unsigned_int,unsigned_int>
            (SVar1,dst.super_FlatBufferBuilder.string_pool._4_4_,"\'dst.GetSize()\' != \'src_size\'"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x73,
             "static void BuilderTests<GrpcLikeMessageBuilder>::builder_movector_after_finish_test() [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
            );
  m1_name_abi_cxx11_();
  color = m1_color();
  val = release_n_verify((FlatBufferBuilder *)&dst,&local_158,color);
  TestEq<bool,bool>(true,val,"\'true\' != \'release_n_verify(dst, m1_name(), m1_color())\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                    ,0x74,
                    "static void BuilderTests<GrpcLikeMessageBuilder>::builder_movector_after_finish_test() [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
                   );
  std::__cxx11::string::~string((string *)&local_158);
  SVar1 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize((FlatBufferBuilderImpl<false> *)&src);
  TestEq<unsigned_int,int>
            (SVar1,0,"\'src.GetSize()\' != \'0\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x75,
             "static void BuilderTests<GrpcLikeMessageBuilder>::builder_movector_after_finish_test() [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
            );
  GrpcLikeMessageBuilder::~GrpcLikeMessageBuilder((GrpcLikeMessageBuilder *)local_138);
  GrpcLikeMessageBuilder::~GrpcLikeMessageBuilder((GrpcLikeMessageBuilder *)local_90);
  return;
}

Assistant:

static void builder_movector_after_finish_test() {
    SrcBuilder src;
    auto root_offset1 = populate1(src);
    src.Finish(root_offset1);
    auto src_size = src.GetSize();
    DestBuilder dst(std::move(src));
    TEST_EQ_FUNC(dst.GetSize(), src_size);
    TEST_ASSERT_FUNC(release_n_verify(dst, m1_name(), m1_color()));
    TEST_EQ_FUNC(src.GetSize(), 0);
  }